

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  TokenType TVar2;
  pointer pEVar3;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_138;
  Enum local_12c;
  undefined4 local_128;
  Enum local_124;
  Var local_120;
  Token local_d8;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_88;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_> field
  ;
  undefined1 local_70 [8];
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  name.field_2._12_4_ = Expect(this,Elem);
  bVar1 = Failed((Result)name.field_2._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)local_70);
  ParseBindVarOpt(this,(string *)local_70);
  MakeUnique<wabt::ElemSegmentModuleField,wabt::Location&,std::__cxx11::string&>
            ((wabt *)&local_88,(Location *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  TVar2 = Peek(this,0);
  if (TVar2 == Passive) {
    Consume(&local_d8,this);
    Token::~Token(&local_d8);
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_88);
    (pEVar3->elem_segment).passive = true;
  }
  else {
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_88);
    Var::Var(&local_120,0,(Location *)local_48);
    ParseVarOpt(this,&(pEVar3->elem_segment).table_var,&local_120);
    Var::~Var(&local_120);
    pEVar3 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(&local_88);
    local_124 = (Enum)ParseOffsetExpr(this,&(pEVar3->elem_segment).offset);
    bVar1 = Failed((Result)local_124);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_016d7a30;
    }
  }
  pEVar3 = std::
           unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ::operator->(&local_88);
  ParseVarListOpt(this,&(pEVar3->elem_segment).vars);
  local_12c = (Enum)Expect(this,Rpar);
  bVar1 = Failed((Result)local_12c);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::
    unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
    unique_ptr(&local_138,&local_88);
    Module::AppendField(module,&local_138);
    std::
    unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>::
    ~unique_ptr(&local_138);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
LAB_016d7a30:
  local_128 = 1;
  std::unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  ::~unique_ptr(&local_88);
  std::__cxx11::string::~string((string *)local_70);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);
  std::string name;
  ParseBindVarOpt(&name);
  auto field = MakeUnique<ElemSegmentModuleField>(loc, name);

  if (Peek() == TokenType::Passive) {
    Consume();
    field->elem_segment.passive = true;
  } else {
    ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    CHECK_RESULT(ParseOffsetExpr(&field->elem_segment.offset));
  }
  ParseVarListOpt(&field->elem_segment.vars);
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}